

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_nav2Duu.cpp
# Opt level: O0

int __thiscall
EnvironmentNAV2DUU::GetFromToHeuristic(EnvironmentNAV2DUU *this,int FromStateID,int ToStateID)

{
  char *what_arg;
  SBPL_Exception *in_stack_ffffffffffffffe0;
  
  what_arg = (char *)__cxa_allocate_exception(0x10);
  SBPL_Exception::SBPL_Exception(in_stack_ffffffffffffffe0,what_arg);
  __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
}

Assistant:

int EnvironmentNAV2DUU::GetFromToHeuristic(int FromStateID, int ToStateID)
{
#if USE_HEUR==0
    return 0;
#endif

    //define this function if it is used in the planner

    throw SBPL_Exception("ERROR in EnvNAV2DUU.. function: FromToHeuristic is undefined");

    return 0;
}